

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonstats.cpp
# Opt level: O3

stat_t * simdjson_computestats(stat_t *__return_storage_ptr__,string_view *p)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  size_t sVar4;
  size_t count;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  ParsedJson pj;
  ParsedJson local_80 [36];
  uint local_5c;
  ulong *local_50;
  
  build_parsed_json((uchar *)local_80,(ulong)p->_M_str,SUB81(p->_M_len,0));
  bVar3 = (bool)ParsedJson::isValid();
  __return_storage_ptr__->valid = bVar3;
  if (bVar3 != false) {
    sVar4 = p->_M_len;
    if (sVar4 == 0) {
      __return_storage_ptr__->backslash_count = 0;
      sVar5 = 0;
    }
    else {
      pcVar2 = p->_M_str;
      sVar5 = 0;
      sVar6 = 0;
      do {
        sVar6 = sVar6 + (pcVar2[sVar5] == '\\');
        sVar5 = sVar5 + 1;
      } while (sVar4 != sVar5);
      __return_storage_ptr__->backslash_count = sVar6;
      sVar6 = 0;
      sVar5 = 0;
      do {
        sVar5 = sVar5 + ((byte)pcVar2[sVar6] >> 7);
        sVar6 = sVar6 + 1;
      } while (sVar4 != sVar6);
    }
    __return_storage_ptr__->nonasciibyte_count = sVar5;
    __return_storage_ptr__->byte_count = sVar4;
    __return_storage_ptr__->structural_indexes_count = (ulong)local_5c;
    if ((char)(*local_50 >> 0x38) != 'r') {
      __assert_fail("type == \'r\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gian99Santos[P]simdjson/tools/jsonstats.cpp"
                    ,0x45,"stat_t simdjson_computestats(const std::string_view &)");
    }
    uVar12 = *local_50 & 0xffffffffffffff;
    if (uVar12 < 2) {
      sVar4 = 0;
      sVar5 = 0;
      sVar6 = 0;
      sVar7 = 0;
      sVar9 = 0;
      sVar10 = 0;
      sVar11 = 0;
      sVar8 = 0;
    }
    else {
      uVar13 = 1;
      sVar8 = 0;
      sVar11 = 0;
      sVar10 = 0;
      sVar9 = 0;
      sVar7 = 0;
      sVar6 = 0;
      sVar5 = 0;
      sVar4 = 0;
      do {
        bVar1 = *(byte *)((long)local_50 + uVar13 * 8 + 7);
        if (bVar1 < 0x6c) {
          if (bVar1 < 100) {
            if (bVar1 == 0x22) {
              sVar11 = sVar11 + 1;
            }
            else if (bVar1 == 0x5b) {
              sVar8 = sVar8 + 1;
            }
          }
          else if (bVar1 == 100) {
            sVar5 = sVar5 + 1;
LAB_00102474:
            uVar13 = uVar13 + 1;
          }
          else if (bVar1 == 0x66) {
            sVar9 = sVar9 + 1;
          }
        }
        else if (bVar1 < 0x74) {
          if (bVar1 == 0x6c) {
            sVar4 = sVar4 + 1;
            goto LAB_00102474;
          }
          if (bVar1 == 0x6e) {
            sVar6 = sVar6 + 1;
          }
        }
        else if (bVar1 == 0x74) {
          sVar7 = sVar7 + 1;
        }
        else if (bVar1 == 0x7b) {
          sVar10 = sVar10 + 1;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < uVar12);
    }
    __return_storage_ptr__->array_count = sVar8;
    __return_storage_ptr__->string_count = sVar11;
    __return_storage_ptr__->object_count = sVar10;
    __return_storage_ptr__->false_count = sVar9;
    __return_storage_ptr__->true_count = sVar7;
    __return_storage_ptr__->null_count = sVar6;
    __return_storage_ptr__->float_count = sVar5;
    __return_storage_ptr__->integer_count = sVar4;
  }
  ParsedJson::~ParsedJson(local_80);
  return __return_storage_ptr__;
}

Assistant:

stat_t simdjson_computestats(const std::string_view &p) {
  stat_t answer;
  ParsedJson pj = build_parsed_json(p);
  answer.valid = pj.isValid();
  if (!answer.valid) {
    return answer;
  }
  answer.backslash_count = count_backslash(reinterpret_cast<const uint8_t*>(p.data()), p.size());
  answer.nonasciibyte_count = count_nonasciibytes(reinterpret_cast<const uint8_t*>(p.data()), p.size());
  answer.byte_count = p.size();
  answer.integer_count = 0;
  answer.float_count = 0;
  answer.object_count = 0;
  answer.array_count = 0;
  answer.null_count = 0;
  answer.true_count = 0;
  answer.false_count = 0;
  answer.string_count = 0;
  answer.structural_indexes_count = pj.n_structural_indexes;
  size_t tapeidx = 0;
  uint64_t tape_val = pj.tape[tapeidx++];
  uint8_t type = (tape_val >> 56);
  size_t howmany = 0;
  assert(type == 'r');
  howmany = tape_val & JSONVALUEMASK;
  for (; tapeidx < howmany; tapeidx++) {
    tape_val = pj.tape[tapeidx];
    // uint64_t payload = tape_val & JSONVALUEMASK;
    type = (tape_val >> 56);
    switch (type) {
    case 'l': // we have a long int
      answer.integer_count++;
      tapeidx++; // skipping the integer
      break;
    case 'd': // we have a double
      answer.float_count++;
      tapeidx++; // skipping the double
      break;
    case 'n': // we have a null
      answer.null_count++;
      break;
    case 't': // we have a true
      answer.true_count++;
      break;
    case 'f': // we have a false
      answer.false_count++;
      break;
    case '{': // we have an object
      answer.object_count++;
      break;
    case '}': // we end an object
      break;
    case '[': // we start an array
      answer.array_count++;
      break;
    case ']': // we end an array
      break;
    case '"': // we have a string
      answer.string_count++;
      break;
    default:
      break; // ignore
    }
  }
  return answer;
}